

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

void __thiscall Kss_Emu::set_bank(Kss_Emu *this,int logical,int physical)

{
  uint uVar1;
  int addr_00;
  int in_EDX;
  int in_ESI;
  Kss_Emu *in_RDI;
  uint offset;
  long phys;
  byte_ *data;
  uint addr;
  uint bank_size;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  void *in_stack_ffffffffffffffc0;
  byte *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar2;
  int local_18;
  
  uVar1 = Kss_Emu::bank_size(in_RDI);
  local_18 = 0x8000;
  if ((in_ESI != 0) && (uVar1 == 0x2000)) {
    local_18 = 0xa000;
  }
  if (in_EDX - (uint)(in_RDI->header_).super_header_t.first_bank < (uint)in_RDI->bank_count) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 0x2000) {
      addr_00 = local_18 + uVar2;
      this_00 = in_RDI->unmapped_write;
      Rom_Data<8192>::at_addr((Rom_Data<8192> *)this_00,addr_00);
      Kss_Cpu::map_mem((Kss_Cpu *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                       (uint)((ulong)in_RDI >> 0x20),(blargg_ulong)in_RDI,this_00,
                       (void *)CONCAT44(addr_00,in_stack_ffffffffffffffb8));
    }
  }
  else {
    Kss_Cpu::map_mem((Kss_Cpu *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (uint)((ulong)in_RDI >> 0x20),(blargg_ulong)in_RDI,in_stack_ffffffffffffffc0,
                     (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

void Kss_Emu::set_bank( int logical, int physical )
{
	unsigned const bank_size = this->bank_size();
	
	unsigned addr = 0x8000;
	if ( logical && bank_size == 8 * 1024 )
		addr = 0xA000;
	
	physical -= header_.first_bank;
	if ( (unsigned) physical >= (unsigned) bank_count )
	{
		byte* data = ram + addr;
		cpu::map_mem( addr, bank_size, data, data );
	}
	else
	{
		long phys = physical * (blargg_long) bank_size;
		for ( unsigned offset = 0; offset < bank_size; offset += page_size )
			cpu::map_mem( addr + offset, page_size,
					unmapped_write, rom.at_addr( phys + offset ) );
	}
}